

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_dwa_encoder.h
# Opt level: O3

exr_result_t LossyDctEncoder_execute(LossyDctEncoder *e)

{
  float fVar1;
  int iVar2;
  DctCoderChannelData *pDVar3;
  long lVar4;
  uint16_t *puVar5;
  float *data;
  uint uVar6;
  char cVar7;
  LossyDctEncoder *pLVar8;
  int i;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  void *pvVar12;
  ushort *puVar13;
  uint uVar14;
  int iVar15;
  uint8_t *puVar16;
  unsigned_short uVar17;
  int iVar18;
  long lVar19;
  int iVar20;
  uint uVar21;
  unsigned_short *puVar22;
  uint uVar23;
  int iVar24;
  uint uVar25;
  long lVar26;
  int x;
  long lVar27;
  ushort *puVar28;
  int y;
  ulong uVar29;
  long lVar30;
  ushort uVar31;
  ulong uVar32;
  float fVar33;
  float fVar34;
  DctCoderChannelData *chanData [3];
  uint16_t halfZigCoef [64];
  uint16_t halfCoef [64];
  long local_1b8 [3];
  void *local_1a0;
  long local_198;
  LossyDctEncoder *local_190;
  ulong local_188;
  ulong local_180;
  long local_178;
  long local_170;
  ulong local_168;
  ushort *local_160;
  ulong local_158;
  ulong local_150;
  ulong local_148;
  long local_140;
  ushort local_138 [64];
  unsigned_short auStack_b8 [68];
  
  iVar20 = e->_width;
  iVar2 = e->_channel_encode_data_count;
  uVar32 = (ulong)iVar2;
  iVar10 = e->_height;
  fVar33 = ceilf((float)iVar20 * 0.125);
  fVar34 = ceilf((float)iVar10 * 0.125);
  uVar9 = (uint)fVar33;
  uVar21 = (uint)fVar34;
  iVar18 = 0;
  puVar28 = (ushort *)e->_packedAc;
  e->_numAcComp = 0;
  e->_numDcComp = 0;
  local_190 = e;
  if (uVar32 == 0) {
    local_1a0 = (void *)0x0;
  }
  else {
    uVar11 = 0;
    do {
      pDVar3 = e->_channel_encode_data[uVar11];
      local_1b8[uVar11] = (long)pDVar3;
      iVar24 = 0;
      if (pDVar3->_type == EXR_PIXEL_FLOAT) {
        iVar24 = iVar10 * iVar20;
      }
      iVar18 = iVar18 + iVar24;
      uVar11 = uVar11 + 1;
    } while ((uVar11 & 0xffffffff) < uVar32);
    if (iVar18 == 0) {
      pvVar12 = (void *)0x0;
    }
    else {
      pvVar12 = internal_exr_alloc((long)iVar18 * 2);
      if (pvVar12 == (void *)0x0) {
        return 1;
      }
    }
    local_1a0 = pvVar12;
    if (iVar2 != 0) {
      uVar11 = 0;
      do {
        lVar19 = local_1b8[uVar11];
        if ((*(int *)(lVar19 + 0x198) == 2) && (iVar20 = e->_height, 0 < (long)iVar20)) {
          uVar14 = e->_width;
          lVar26 = 0;
          do {
            lVar30 = *(long *)(lVar19 + 0x180);
            if (0 < (int)uVar14) {
              lVar4 = *(long *)(lVar30 + lVar26 * 8);
              uVar29 = 0;
              do {
                fVar33 = *(float *)(lVar4 + uVar29 * 4);
                fVar34 = 65504.0;
                if ((fVar33 <= 65504.0) && (fVar34 = fVar33, fVar33 < -65504.0)) {
                  fVar34 = -65504.0;
                }
                fVar33 = ABS(fVar34);
                uVar31 = (ushort)((uint)fVar34 >> 0x10) & 0x8000;
                if ((uint)fVar33 < 0x38800000) {
                  if ((0x33000000 < (uint)fVar33) &&
                     (uVar23 = (uint)fVar34 & 0x7fffff | 0x800000,
                     cVar7 = (char)((uint)fVar33 >> 0x17),
                     uVar31 = uVar31 | (ushort)(uVar23 >> (0x7eU - cVar7 & 0x1f)),
                     0x80000000 < uVar23 << (cVar7 + 0xa2U & 0x1f))) {
                    uVar31 = uVar31 + 1;
                  }
                }
                else if ((uint)fVar33 < 0x7f800000) {
                  if ((uint)fVar33 < 0x477ff000) {
                    uVar31 = (ushort)((int)fVar33 + 0x8000fff +
                                      (uint)(((uint)fVar33 >> 0xd & 1) != 0) >> 0xd) | uVar31;
                  }
                  else {
                    uVar31 = uVar31 | 0x7c00;
                  }
                }
                else {
                  uVar31 = uVar31 | 0x7c00;
                  if (fVar33 != INFINITY) {
                    uVar23 = (uint)fVar33 >> 0xd & 0x3ff;
                    uVar31 = uVar31 | (ushort)uVar23 | (ushort)(uVar23 == 0);
                  }
                }
                *(ushort *)((long)pvVar12 + uVar29 * 2) = uVar31;
                uVar29 = uVar29 + 1;
              } while (uVar14 != uVar29);
            }
            *(void **)(lVar30 + lVar26 * 8) = pvVar12;
            pvVar12 = (void *)((long)pvVar12 + (long)(int)uVar14 * 2);
            lVar26 = lVar26 + 1;
          } while (lVar26 != iVar20);
        }
        uVar11 = (ulong)((int)uVar11 + 1);
        e = local_190;
      } while (uVar11 < uVar32);
      puVar16 = local_190->_packedDc;
      *(uint8_t **)(local_1b8[0] + 0x1a0) = puVar16;
      local_198 = local_1b8[0];
      if (iVar2 != 1) {
        puVar16 = puVar16 + (long)(int)(uVar21 * uVar9) * 2;
        uVar11 = 1;
        do {
          *(uint8_t **)(local_1b8[uVar11] + 0x1a0) = puVar16;
          uVar11 = uVar11 + 1;
          puVar16 = puVar16 + (long)(int)(uVar21 * uVar9) * 2;
        } while (uVar32 != uVar11);
      }
      goto LAB_0010cc03;
    }
  }
  local_198 = local_1b8[0];
  *(uint8_t **)(local_1b8[0] + 0x1a0) = e->_packedDc;
LAB_0010cc03:
  if (0 < (int)uVar21) {
    local_188 = (ulong)uVar21;
    local_168 = (ulong)uVar9;
    uVar11 = 0;
    do {
      local_180 = uVar11;
      if (0 < (int)uVar9) {
        local_170 = local_1b8[1];
        local_178 = local_1b8[2];
        local_140 = uVar11 * 8;
        uVar29 = 0xffffffff;
        iVar20 = 0;
        uVar11 = 0;
        do {
          pLVar8 = local_190;
          local_158 = uVar11;
          local_150 = uVar29;
          if (iVar2 != 0) {
            local_160 = puVar28;
            iVar10 = e->_width;
            iVar18 = e->_height;
            puVar5 = e->_toNonlinear;
            uVar11 = 0;
            do {
              local_148 = uVar11;
              lVar19 = local_1b8[uVar11];
              lVar26 = *(long *)(lVar19 + 0x180);
              lVar30 = 0;
              do {
                uVar14 = (int)local_140 + (int)lVar30;
                uVar21 = ~uVar14 + iVar18 * 2;
                if ((int)uVar14 < iVar18) {
                  uVar21 = uVar14;
                }
                if ((int)uVar21 < 0) {
                  uVar21 = iVar18 - 1;
                }
                lVar4 = *(long *)(lVar26 + (long)(int)uVar21 * 8);
                lVar27 = 0;
                iVar24 = (int)uVar29 + iVar10 * 2;
                do {
                  iVar15 = iVar20 + (int)lVar27;
                  if (iVar10 <= iVar15) {
                    iVar15 = iVar24;
                  }
                  if (iVar15 < 0) {
                    iVar15 = iVar10 + -1;
                  }
                  uVar31 = *(ushort *)(lVar4 + (long)iVar15 * 2);
                  if (puVar5 != (uint16_t *)0x0) {
                    uVar31 = puVar5[uVar31];
                  }
                  uVar14 = (uVar31 & 0x7fff) << 0xd;
                  uVar21 = (int)(short)uVar31 & 0x80000000;
                  if (uVar14 < 0x800000) {
                    if ((uVar31 & 0x7fff) != 0) {
                      uVar23 = 0x1f;
                      if ((uVar31 & 0x7fff) != 0) {
                        for (; uVar14 >> uVar23 == 0; uVar23 = uVar23 - 1) {
                        }
                      }
                      iVar15 = (uVar23 ^ 0x1f) - 8;
                      uVar21 = (uVar21 | uVar14 << ((byte)iVar15 & 0x1f) | 0x38800000) +
                               iVar15 * -0x800000;
                    }
                  }
                  else if (uVar14 < 0xf800000) {
                    uVar21 = (uVar21 | uVar14) + 0x38000000;
                  }
                  else {
                    uVar21 = uVar21 | uVar14 | 0x7f800000;
                  }
                  *(uint *)(lVar19 + lVar27 * 4) = uVar21;
                  lVar27 = lVar27 + 1;
                  iVar24 = iVar24 + -1;
                } while (lVar27 != 8);
                lVar30 = lVar30 + 1;
                lVar19 = lVar19 + 0x20;
              } while (lVar30 != 8);
              uVar11 = uVar11 + 1;
            } while (uVar11 != uVar32);
            if (iVar2 == 3) {
              lVar19 = 0;
              do {
                fVar33 = *(float *)(local_198 + lVar19 * 4);
                fVar34 = *(float *)(local_170 + lVar19 * 4);
                fVar1 = *(float *)(local_178 + lVar19 * 4);
                *(float *)(local_198 + lVar19 * 4) =
                     fVar1 * 0.0722 + fVar33 * 0.2126 + fVar34 * 0.7152;
                *(float *)(local_170 + lVar19 * 4) =
                     fVar1 * 0.5 + fVar33 * -0.1146 + fVar34 * -0.3854;
                *(float *)(local_178 + lVar19 * 4) =
                     fVar1 * -0.0458 + fVar33 * 0.5 + fVar34 * -0.4542;
                lVar19 = lVar19 + 1;
              } while (lVar19 != 0x40);
            }
            e = pLVar8;
            if (iVar2 != 0) {
              lVar19 = 0x50;
              uVar11 = 0;
              do {
                data = (float *)local_1b8[uVar11];
                dctForward8x8(data);
                lVar26 = 0;
                do {
                  fVar33 = data[lVar26];
                  fVar34 = ABS(fVar33);
                  uVar21 = (uint)fVar33 >> 0x10 & 0x8000;
                  if ((uint)fVar34 < 0x38800000) {
                    if ((0x33000000 < (uint)fVar34) &&
                       (uVar14 = (uint)fVar33 & 0x7fffff | 0x800000,
                       cVar7 = (char)((uint)fVar34 >> 0x17),
                       uVar21 = uVar21 | uVar14 >> (0x7eU - cVar7 & 0x1f),
                       0x80000000 < uVar14 << (cVar7 + 0xa2U & 0x1f))) {
                      uVar21 = uVar21 + 1;
                    }
                  }
                  else if ((uint)fVar34 < 0x7f800000) {
                    if ((uint)fVar34 < 0x477ff000) {
                      uVar21 = (int)fVar34 + 0x8000fff + (uint)(((uint)fVar34 >> 0xd & 1) != 0) >>
                               0xd | uVar21;
                    }
                    else {
                      uVar21 = uVar21 | 0x7c00;
                    }
                  }
                  else {
                    uVar21 = uVar21 | 0x7c00;
                    if (fVar34 != INFINITY) {
                      uVar14 = (uint)fVar34 >> 0xd & 0x3ff;
                      uVar21 = uVar21 | uVar14 | (uint)(uVar14 == 0);
                    }
                  }
                  uVar14 = uVar21 & 0xffff;
                  uVar17 = (unsigned_short)uVar21;
                  if ((uint)*(ushort *)(countSetBits_numBitsSet + (ulong)(uVar14 >> 8) * 2) +
                      (uint)*(ushort *)(countSetBits_numBitsSet + ((ulong)uVar14 & 0xff) * 2) != 0)
                  {
                    puVar22 = closestData + closestDataOffset[uVar14];
                    uVar14 = (uint)*(ushort *)(countSetBits_numBitsSet + (ulong)(uVar14 >> 8) * 2) +
                             (uint)*(ushort *)(countSetBits_numBitsSet + ((ulong)uVar14 & 0xff) * 2)
                             + 1;
                    do {
                      uVar23 = (uint)(short)*puVar22;
                      uVar25 = (uVar23 & 0x7fff) << 0xd;
                      fVar34 = (float)(uVar23 & 0x80000000);
                      if (uVar25 < 0x800000) {
                        if ((uVar23 & 0x7fff) != 0) {
                          uVar6 = 0x1f;
                          if ((uVar23 & 0x7fff) != 0) {
                            for (; uVar25 >> uVar6 == 0; uVar6 = uVar6 - 1) {
                            }
                          }
                          iVar10 = (uVar6 ^ 0x1f) - 8;
                          fVar34 = (float)(((uint)fVar34 | uVar25 << ((byte)iVar10 & 0x1f) |
                                           0x38800000) + iVar10 * -0x800000);
                        }
                      }
                      else if (uVar25 < 0xf800000) {
                        fVar34 = (float)(((uint)fVar34 | uVar25) + 0x38000000);
                      }
                      else {
                        fVar34 = (float)((uint)fVar34 | uVar25 | 0x7f800000);
                      }
                      uVar17 = *puVar22;
                      if (ABS(fVar34 - fVar33) <
                          *(float *)((long)pLVar8->_channel_encode_data +
                                    lVar26 * 4 + lVar19 + -0x20)) break;
                      puVar22 = puVar22 + 1;
                      uVar14 = uVar14 - 1;
                      uVar17 = (unsigned_short)uVar21;
                    } while (1 < uVar14);
                  }
                  auStack_b8[lVar26] = uVar17;
                  lVar26 = lVar26 + 1;
                } while (lVar26 != 0x40);
                puVar13 = local_138;
                lVar19 = 0;
                do {
                  *puVar13 = auStack_b8[*(int *)((long)&toZigZag_remap + lVar19)];
                  lVar19 = lVar19 + 4;
                  puVar13 = puVar13 + 1;
                } while (lVar19 != 0x100);
                puVar13 = *(ushort **)(data + 0x68);
                *(ushort **)(data + 0x68) = puVar13 + 1;
                *puVar13 = local_138[0];
                pLVar8->_numDcComp = pLVar8->_numDcComp + 1;
                iVar10 = 1;
                do {
                  if (local_138[iVar10] == 0) {
                    iVar18 = 1;
                    if (iVar10 < 0x3f) {
                      lVar19 = 0;
                      do {
                        iVar24 = (int)lVar19;
                        if (local_138[iVar10 + iVar24 + 1] != 0) {
                          if (lVar19 == 0) goto LAB_0010d175;
                          iVar18 = iVar24 + 1;
                          if (iVar10 + iVar24 == 0x3f) {
                            uVar31 = 0xff00;
                          }
                          else {
                            uVar31 = (short)lVar19 + 1U | 0xff00;
                          }
                          goto LAB_0010d177;
                        }
                        lVar19 = lVar19 + 1;
                      } while (0x3f - (long)iVar10 != lVar19);
                      uVar31 = 0xff00;
                      iVar18 = 0x40 - iVar10;
                    }
                    else {
LAB_0010d175:
                      uVar31 = 0;
                    }
LAB_0010d177:
                    *puVar28 = uVar31;
                    pLVar8->_numAcComp = pLVar8->_numAcComp + 1;
                    iVar10 = iVar18 + iVar10;
                  }
                  else {
                    *puVar28 = local_138[iVar10];
                    pLVar8->_numAcComp = pLVar8->_numAcComp + 1;
                    iVar10 = iVar10 + 1;
                  }
                  puVar28 = puVar28 + 1;
                } while (iVar10 < 0x40);
                uVar11 = uVar11 + 1;
                lVar19 = 0x150;
              } while (uVar11 != uVar32);
            }
          }
          uVar11 = local_158 + 1;
          iVar20 = iVar20 + 8;
          uVar29 = (ulong)((int)local_150 - 8);
        } while (uVar11 != local_168);
      }
      uVar11 = local_180 + 1;
    } while (uVar11 != local_188);
  }
  if (local_1a0 != (void *)0x0) {
    internal_exr_free(local_1a0);
  }
  return 0;
}

Assistant:

exr_result_t
LossyDctEncoder_execute (LossyDctEncoder* e)
{
    size_t               numComp = e->_channel_encode_data_count;
    DctCoderChannelData* chanData[3];

    int numBlocksX = (int) ceilf ((float) e->_width / 8.0f);
    int numBlocksY = (int) ceilf ((float) e->_height / 8.0f);

    uint16_t halfZigCoef[64];
    uint16_t halfCoef[64];

    uint16_t* currAcComp = (uint16_t*) e->_packedAc;

    e->_numAcComp = 0;
    e->_numDcComp = 0;

    //
    // Allocate a temp half buffer to quantize into for
    // any FLOAT source channels.
    //
    int tmpHalfBufferElements = 0;

    for (unsigned int chan = 0; chan < numComp; ++chan)
    {
        chanData[chan] = e->_channel_encode_data[chan];
        if (chanData[chan]->_type == EXR_PIXEL_FLOAT)
            tmpHalfBufferElements += e->_width * e->_height;
    }

    uint16_t* tmpHalfBuffer    = NULL;
    uint16_t* tmpHalfBufferPtr = NULL;
    if (tmpHalfBufferElements)
    {
        tmpHalfBuffer = (uint16_t*) internal_exr_alloc (
            tmpHalfBufferElements * sizeof (uint16_t));
        if (!tmpHalfBuffer) return EXR_ERR_OUT_OF_MEMORY;
        tmpHalfBufferPtr = tmpHalfBuffer;
    }

    //
    // Run over all the float scanlines, quantizing,
    // and re-assigning _rowPtr[y]. We need to translate
    // FLOAT XDR to HALF XDR.
    //

    for (unsigned int chan = 0; chan < numComp; ++chan)
    {
        if (chanData[chan]->_type != EXR_PIXEL_FLOAT) continue;

        for (int y = 0; y < e->_height; ++y)
        {
            const float* srcXdr = (const float*) chanData[chan]->_rows[y];

            for (int x = 0; x < e->_width; ++x)
            {
                //
                // Clamp to half ranges, instead of just casting. This
                // avoids introducing Infs which end up getting zeroed later
                //
                float src = one_to_native_float (srcXdr[x]);
                if (src > 65504.f)
                    src = 65504.f;
                else if (src < -65504.f)
                    src = -65504.f;
                tmpHalfBufferPtr[x] = one_from_native16 (float_to_half (src));
            }

            chanData[chan]->_rows[y] = (uint8_t*) tmpHalfBufferPtr;
            tmpHalfBufferPtr += e->_width;
        }
    }

    //
    // Pack DC components together by common plane, so we can get
    // a little more out of differencing them. We'll always have
    // one component per block, so we can computed offsets.
    //

    chanData[0]->_dc_comp = (uint16_t*) e->_packedDc;
    for (size_t chan = 1; chan < numComp; ++chan)
        chanData[chan]->_dc_comp =
            chanData[chan - 1]->_dc_comp + numBlocksX * numBlocksY;

    for (int blocky = 0; blocky < numBlocksY; ++blocky)
    {
        for (int blockx = 0; blockx < numBlocksX; ++blockx)
        {
            uint16_t h;

            for (size_t chan = 0; chan < numComp; ++chan)
            {
                //
                // Break the source into 8x8 blocks. If we don't
                // fit at the edges, mirror.
                //
                // Also, convert from linear to nonlinear representation.
                // Our source is assumed to be XDR, and we need to convert
                // to NATIVE prior to converting to float.
                //
                // If we're converting linear -> nonlinear, assume that the
                // XDR -> NATIVE conversion is built into the lookup. Otherwise,
                // we'll need to explicitly do it.
                //

                for (int y = 0; y < 8; ++y)
                {
                    for (int x = 0; x < 8; ++x)
                    {
                        int vx = 8 * blockx + x;
                        int vy = 8 * blocky + y;

                        if (vx >= e->_width)
                            vx = e->_width - (vx - (e->_width - 1));

                        if (vx < 0) vx = e->_width - 1;

                        if (vy >= e->_height)
                            vy = e->_height - (vy - (e->_height - 1));

                        if (vy < 0) vy = e->_height - 1;

                        h = ((const uint16_t*) (chanData[chan]->_rows)[vy])[vx];

                        if (e->_toNonlinear) { h = e->_toNonlinear[h]; }
                        else { h = one_to_native16 (h); }

                        chanData[chan]->_dctData[y * 8 + x] = half_to_float (h);
                    } // x
                }     // y
            }         // chan

            //
            // Color space conversion
            //

            if (numComp == 3)
            {
                csc709Forward64 (
                    chanData[0]->_dctData,
                    chanData[1]->_dctData,
                    chanData[2]->_dctData);
            }

            const float* quantTable = e->_quantTableY;
            for (size_t chan = 0; chan < numComp; ++chan)
            {
                //
                // Forward DCT
                //
                dctForward8x8 (chanData[chan]->_dctData);

                //
                // Quantize to half, and zigzag
                //

                for (int i = 0; i < 64; ++i)
                {
                    halfCoef[i] = quantize (
                        chanData[chan]->_dctData[i],
                        quantTable[i]);
                }

                toZigZag (halfZigCoef, halfCoef);

                //
                // Convert from NATIVE back to XDR, before we write out
                //
                priv_from_native16 (halfZigCoef, 64);

                //
                // Save the DC component separately, to be compressed on
                // its own.
                //

                *(chanData[chan]->_dc_comp)++ = halfZigCoef[0];
                e->_numDcComp++;

                //
                // Then RLE the AC components (which will record the count
                // of the resulting number of items)
                //

                LossyDctEncoder_rleAc (e, halfZigCoef, &currAcComp);
                quantTable = e->_quantTableCbCr;
            } // chan
        }     // blockx
    }         // blocky

    if (tmpHalfBuffer) internal_exr_free (tmpHalfBuffer);

    return EXR_ERR_SUCCESS;
}